

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

char * luaL_checklstring(lua_State *L,int idx,size_t *len)

{
  TValue *pTVar1;
  GCstr *pGVar2;
  ulong *in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  GCstr *s;
  TValue *o;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  lua_State *in_stack_ffffffffffffff70;
  
  pTVar1 = index2adr(in_RDI,in_ESI);
  if ((pTVar1->field_2).it == 0xfffffffb) {
    pGVar2 = (GCstr *)(ulong)(pTVar1->u32).lo;
  }
  else {
    if (0xfffeffff < (pTVar1->field_2).it) {
      lj_err_argt(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    }
    if (*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x54) <=
        *(uint *)((ulong)(in_RDI->glref).ptr32 + 0x50)) {
      lj_gc_step((lua_State *)&pTVar1->field_2);
    }
    pTVar1 = index2adr(in_RDI,in_ESI);
    pGVar2 = lj_strfmt_number(in_stack_ffffffffffffff70,
                              (cTValue *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    (pTVar1->u32).lo = (uint32_t)pGVar2;
    (pTVar1->field_2).it = 0xfffffffb;
  }
  if (in_RDX != (ulong *)0x0) {
    *in_RDX = (ulong)pGVar2->len;
  }
  return (char *)(pGVar2 + 1);
}

Assistant:

LUALIB_API const char *luaL_checklstring(lua_State *L, int idx, size_t *len)
{
  TValue *o = index2adr(L, idx);
  GCstr *s;
  if (LJ_LIKELY(tvisstr(o))) {
    s = strV(o);
  } else if (tvisnumber(o)) {
    lj_gc_check(L);
    o = index2adr(L, idx);  /* GC may move the stack. */
    s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
  } else {
    lj_err_argt(L, idx, LUA_TSTRING);
  }
  if (len != NULL) *len = s->len;
  return strdata(s);
}